

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall
cs_impl::any::holder<cs::callable>::holder<cs_impl::cni,cs::callable::types>
          (holder<cs::callable> *this,cni *args,types *args_1)

{
  types tVar1;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_0023f630;
  std::function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>::
  function<cs_impl::cni,void>
            ((function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)> *)
             local_38._M_pod_data,args);
  tVar1 = *args_1;
  *(undefined8 *)&(this->mDat).mFunc.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mDat).mFunc.super__Function_base._M_functor + 8) = 0;
  (this->mDat).mFunc.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mDat).mFunc._M_invoker = p_Stack_20;
  if (local_28 != (_Manager_type)0x0) {
    *(void **)&(this->mDat).mFunc.super__Function_base._M_functor = local_38._M_unused._M_object;
    *(undefined8 *)((long)&(this->mDat).mFunc.super__Function_base._M_functor + 8) = local_38._8_8_;
    (this->mDat).mFunc.super__Function_base._M_manager = local_28;
    local_28 = (_Manager_type)0x0;
    p_Stack_20 = (_Invoker_type)0x0;
  }
  (this->mDat).mType = tVar1;
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}